

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SpectrumPtexTexture *
pbrt::SpectrumPtexTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  SpectrumPtexTexture *pSVar1;
  polymorphic_allocator<std::byte> *in_RSI;
  ColorEncodingHandle encoding;
  string encodingString;
  string filename;
  string *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  TextureParameterDictionary *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  allocator<char> *__a;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [8];
  string *in_stack_ffffffffffffff08;
  string local_e0 [8];
  string *in_stack_ffffffffffffff28;
  allocator<char> local_b9;
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [32];
  string local_40 [40];
  polymorphic_allocator<std::byte> *local_18;
  
  __a = &local_81;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,__a);
  TextureParameterDictionary::GetOneString
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ResolveFilename(in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,__a);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xfffffffffffffed7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,__a);
  TextureParameterDictionary::GetOneString
            ((TextureParameterDictionary *)args,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88)
  ;
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  ColorEncodingHandle::Get(in_stack_ffffffffffffff08);
  pSVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SpectrumPtexTexture,std::__cxx11::string&,pbrt::ColorEncodingHandle&>
                     (local_18,args,(ColorEncodingHandle *)in_stack_fffffffffffffe90);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_40);
  return pSVar1;
}

Assistant:

SpectrumPtexTexture *SpectrumPtexTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
    std::string encodingString = parameters.GetOneString("encoding", "gamma 2.2");
    ColorEncodingHandle encoding = ColorEncodingHandle::Get(encodingString);
    return alloc.new_object<SpectrumPtexTexture>(filename, encoding);
}